

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O1

void embree::avx512::
     BVHNIntersector1<8,_1,_true,_embree::avx512::ArrayIntersector1<embree::avx512::TriangleMiIntersector1Pluecker<4,_true>_>_>
     ::occluded(Intersectors *This,Ray *ray,RayQueryContext *context)

{
  float fVar1;
  undefined8 *puVar4;
  undefined4 uVar5;
  float fVar6;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar7;
  Scene *pSVar8;
  float **ppfVar9;
  float *pfVar10;
  float *pfVar11;
  float *pfVar12;
  float *pfVar13;
  Geometry *pGVar14;
  RTCIntersectArguments *pRVar15;
  bool bVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  ulong uVar20;
  long lVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  int iVar25;
  ulong uVar26;
  ulong uVar27;
  ulong unaff_R12;
  size_t mask;
  ulong uVar28;
  ulong uVar29;
  bool bVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [64];
  undefined1 auVar69 [64];
  undefined1 auVar70 [64];
  undefined1 auVar71 [64];
  undefined1 auVar72 [64];
  undefined1 auVar73 [64];
  UVIdentity<4> mapUV;
  Scene *scene;
  int local_14b4;
  ulong local_14b0;
  NodeRef *local_14a8;
  ulong local_14a0;
  ulong local_1498;
  ulong local_1490;
  ulong local_1488;
  ulong local_1480;
  Ray *local_1478;
  RayQueryContext *local_1470;
  ulong local_1468;
  ulong local_1460;
  HitK<1> h;
  RTCFilterFunctionNArguments args;
  undefined8 local_1338;
  undefined8 uStack_1330;
  undefined8 local_1328;
  undefined8 uStack_1320;
  undefined1 local_1318 [16];
  undefined1 local_1308 [16];
  undefined1 local_12f8 [16];
  UVIdentity<4> *local_12e8;
  byte local_12e0;
  undefined1 local_12d8 [16];
  undefined1 local_12c8 [16];
  undefined1 local_12b8 [16];
  undefined1 local_12a8 [16];
  undefined1 local_1298 [16];
  undefined1 local_1288 [16];
  undefined1 local_1278 [32];
  undefined1 local_1258 [32];
  undefined1 local_1238 [32];
  undefined1 local_1218 [32];
  undefined1 local_11f8 [32];
  NodeRef stack [564];
  float fVar2;
  float fVar3;
  
  if (*(long *)&This->ptr[1].bounds.bounds0.lower.field_0 != 8) {
    if (0.0 <= ray->tfar) {
      local_14a8 = stack + 1;
      aVar7 = (ray->dir).field_0;
      auVar52 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->org).field_0.m128[3]));
      auVar31._8_4_ = 0x7fffffff;
      auVar31._0_8_ = 0x7fffffff7fffffff;
      auVar31._12_4_ = 0x7fffffff;
      auVar31 = vandps_avx512vl((undefined1  [16])aVar7,auVar31);
      auVar32._8_4_ = 0x219392ef;
      auVar32._0_8_ = 0x219392ef219392ef;
      auVar32._12_4_ = 0x219392ef;
      uVar22 = vcmpps_avx512vl(auVar31,auVar32,1);
      auVar31 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar68 = ZEXT1664(auVar31);
      auVar31 = vdivps_avx512vl(auVar31,(undefined1  [16])aVar7);
      auVar32 = vbroadcastss_avx512vl(ZEXT416(0x5d5e0b6b));
      bVar30 = (bool)((byte)uVar22 & 1);
      auVar36._0_4_ = (uint)bVar30 * auVar32._0_4_ | (uint)!bVar30 * auVar31._0_4_;
      bVar30 = (bool)((byte)(uVar22 >> 1) & 1);
      auVar36._4_4_ = (uint)bVar30 * auVar32._4_4_ | (uint)!bVar30 * auVar31._4_4_;
      bVar30 = (bool)((byte)(uVar22 >> 2) & 1);
      auVar36._8_4_ = (uint)bVar30 * auVar32._8_4_ | (uint)!bVar30 * auVar31._8_4_;
      bVar30 = (bool)((byte)(uVar22 >> 3) & 1);
      auVar36._12_4_ = (uint)bVar30 * auVar32._12_4_ | (uint)!bVar30 * auVar31._12_4_;
      auVar33._8_4_ = 0x3f7ffffa;
      auVar33._0_8_ = 0x3f7ffffa3f7ffffa;
      auVar33._12_4_ = 0x3f7ffffa;
      auVar33 = vmulps_avx512vl(auVar36,auVar33);
      auVar34._8_4_ = 0x3f800003;
      auVar34._0_8_ = 0x3f8000033f800003;
      auVar34._12_4_ = 0x3f800003;
      auVar34 = vmulps_avx512vl(auVar36,auVar34);
      auVar53 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->org).field_0.m128[0]));
      auVar69 = ZEXT3264(auVar53);
      auVar53 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->org).field_0.m128[1]));
      auVar70 = ZEXT3264(auVar53);
      auVar53 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->org).field_0.m128[2]));
      auVar71 = ZEXT3264(auVar53);
      stack[0].ptr = *(size_t *)&This->ptr[1].bounds.bounds0.lower.field_0;
      auVar53 = vbroadcastss_avx512vl(auVar33);
      auVar72 = ZEXT3264(auVar53);
      auVar31 = vmovshdup_avx(auVar33);
      auVar53 = vbroadcastsd_avx512vl(auVar31);
      auVar73 = ZEXT3264(auVar53);
      auVar32 = vshufpd_avx(auVar33,auVar33,1);
      auVar56._8_4_ = 2;
      auVar56._0_8_ = 0x200000002;
      auVar56._12_4_ = 2;
      auVar56._16_4_ = 2;
      auVar56._20_4_ = 2;
      auVar56._24_4_ = 2;
      auVar56._28_4_ = 2;
      auVar53 = vpermps_avx512vl(auVar56,ZEXT1632(auVar33));
      auVar54 = vbroadcastss_avx512vl(auVar34);
      auVar55._8_4_ = 1;
      auVar55._0_8_ = 0x100000001;
      auVar55._12_4_ = 1;
      auVar55._16_4_ = 1;
      auVar55._20_4_ = 1;
      auVar55._24_4_ = 1;
      auVar55._28_4_ = 1;
      auVar55 = vpermps_avx512vl(auVar55,ZEXT1632(auVar34));
      auVar56 = vpermps_avx512vl(auVar56,ZEXT1632(auVar34));
      local_14b0 = (ulong)(auVar33._0_4_ < 0.0) << 5;
      uVar22 = (ulong)(auVar31._0_4_ < 0.0) << 5 | 0x40;
      uVar26 = (ulong)(auVar32._0_4_ < 0.0) << 5 | 0x80;
      uVar27 = local_14b0 ^ 0x20;
      uVar28 = uVar22 ^ 0x20;
      uVar29 = uVar26 ^ 0x20;
      auVar57 = vbroadcastss_avx512vl(auVar52);
      auVar58 = vbroadcastss_avx512vl(ZEXT416((uint)ray->tfar));
      local_14a0 = uVar29;
      local_1498 = uVar28;
      local_1490 = uVar27;
      local_1488 = uVar26;
      local_1480 = uVar22;
      do {
        if (local_14a8 == stack) {
          return;
        }
        uVar24 = local_14a8[-1].ptr;
        local_14a8 = local_14a8 + -1;
        do {
          if ((uVar24 & 8) == 0) {
            auVar59 = vsubps_avx512vl(*(undefined1 (*) [32])(uVar24 + 0x40 + local_14b0),
                                      auVar69._0_32_);
            auVar59 = vmulps_avx512vl(auVar72._0_32_,auVar59);
            auVar60 = vsubps_avx512vl(*(undefined1 (*) [32])(uVar24 + 0x40 + uVar22),auVar70._0_32_)
            ;
            auVar60 = vmulps_avx512vl(auVar73._0_32_,auVar60);
            auVar59 = vmaxps_avx(auVar59,auVar60);
            auVar60 = vsubps_avx512vl(*(undefined1 (*) [32])(uVar24 + 0x40 + uVar26),auVar71._0_32_)
            ;
            auVar60 = vmulps_avx512vl(auVar53,auVar60);
            auVar60 = vmaxps_avx512vl(auVar60,auVar57);
            auVar59 = vmaxps_avx(auVar59,auVar60);
            auVar60 = vsubps_avx512vl(*(undefined1 (*) [32])(uVar24 + 0x40 + uVar27),auVar69._0_32_)
            ;
            auVar60 = vmulps_avx512vl(auVar54,auVar60);
            auVar61 = vsubps_avx512vl(*(undefined1 (*) [32])(uVar24 + 0x40 + uVar28),auVar70._0_32_)
            ;
            auVar61 = vmulps_avx512vl(auVar55,auVar61);
            auVar60 = vminps_avx(auVar60,auVar61);
            auVar61 = vsubps_avx512vl(*(undefined1 (*) [32])(uVar24 + 0x40 + uVar29),auVar71._0_32_)
            ;
            auVar61 = vmulps_avx512vl(auVar56,auVar61);
            auVar61 = vminps_avx512vl(auVar61,auVar58);
            auVar60 = vminps_avx(auVar60,auVar61);
            uVar19 = vcmpps_avx512vl(auVar59,auVar60,2);
            unaff_R12 = CONCAT44((int)(unaff_R12 >> 0x20),(uint)(byte)uVar19);
          }
          if ((uVar24 & 8) == 0) {
            if (unaff_R12 == 0) {
              iVar25 = 4;
            }
            else {
              uVar23 = uVar24 & 0xfffffffffffffff0;
              lVar21 = 0;
              for (uVar24 = unaff_R12; (uVar24 & 1) == 0; uVar24 = uVar24 >> 1 | 0x8000000000000000)
              {
                lVar21 = lVar21 + 1;
              }
              iVar25 = 0;
              for (uVar20 = unaff_R12 - 1 & unaff_R12; uVar24 = *(ulong *)(uVar23 + lVar21 * 8),
                  uVar20 != 0; uVar20 = uVar20 - 1 & uVar20) {
                local_14a8->ptr = uVar24;
                local_14a8 = local_14a8 + 1;
                lVar21 = 0;
                for (uVar24 = uVar20; (uVar24 & 1) == 0; uVar24 = uVar24 >> 1 | 0x8000000000000000)
                {
                  lVar21 = lVar21 + 1;
                }
              }
            }
          }
          else {
            iVar25 = 6;
          }
        } while (iVar25 == 0);
        if (iVar25 == 6) {
          iVar25 = 0;
          local_1468 = (ulong)((uint)uVar24 & 0xf) - 8;
          bVar30 = local_1468 != 0;
          if (bVar30) {
            uVar24 = uVar24 & 0xfffffffffffffff0;
            pSVar8 = context->scene;
            local_1460 = 0;
            do {
              lVar21 = local_1460 * 0x50;
              ppfVar9 = (pSVar8->vertices).items;
              pfVar10 = ppfVar9[*(uint *)(uVar24 + 0x30 + lVar21)];
              pfVar11 = ppfVar9[*(uint *)(uVar24 + 0x34 + lVar21)];
              pfVar12 = ppfVar9[*(uint *)(uVar24 + 0x38 + lVar21)];
              pfVar13 = ppfVar9[*(uint *)(uVar24 + 0x3c + lVar21)];
              auVar32 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar10 + *(uint *)(uVar24 + lVar21)),
                                      *(undefined1 (*) [16])
                                       (pfVar12 + *(uint *)(uVar24 + 8 + lVar21)));
              auVar52 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar10 + *(uint *)(uVar24 + lVar21)),
                                      *(undefined1 (*) [16])
                                       (pfVar12 + *(uint *)(uVar24 + 8 + lVar21)));
              auVar33 = vunpcklps_avx(*(undefined1 (*) [16])
                                       (pfVar11 + *(uint *)(uVar24 + 4 + lVar21)),
                                      *(undefined1 (*) [16])
                                       (pfVar13 + *(uint *)(uVar24 + 0xc + lVar21)));
              auVar31 = vunpckhps_avx(*(undefined1 (*) [16])
                                       (pfVar11 + *(uint *)(uVar24 + 4 + lVar21)),
                                      *(undefined1 (*) [16])
                                       (pfVar13 + *(uint *)(uVar24 + 0xc + lVar21)));
              auVar34 = vunpcklps_avx(auVar52,auVar31);
              auVar36 = vunpcklps_avx(auVar32,auVar33);
              auVar31 = vunpckhps_avx(auVar32,auVar33);
              auVar33 = vunpcklps_avx(*(undefined1 (*) [16])
                                       (pfVar10 + *(uint *)(uVar24 + 0x10 + lVar21)),
                                      *(undefined1 (*) [16])
                                       (pfVar12 + *(uint *)(uVar24 + 0x18 + lVar21)));
              auVar52 = vunpckhps_avx(*(undefined1 (*) [16])
                                       (pfVar10 + *(uint *)(uVar24 + 0x10 + lVar21)),
                                      *(undefined1 (*) [16])
                                       (pfVar12 + *(uint *)(uVar24 + 0x18 + lVar21)));
              auVar35 = vunpcklps_avx(*(undefined1 (*) [16])
                                       (pfVar11 + *(uint *)(uVar24 + 0x14 + lVar21)),
                                      *(undefined1 (*) [16])
                                       (pfVar13 + *(uint *)(uVar24 + 0x1c + lVar21)));
              auVar32 = vunpckhps_avx(*(undefined1 (*) [16])
                                       (pfVar11 + *(uint *)(uVar24 + 0x14 + lVar21)),
                                      *(undefined1 (*) [16])
                                       (pfVar13 + *(uint *)(uVar24 + 0x1c + lVar21)));
              auVar39 = vunpcklps_avx(auVar52,auVar32);
              auVar37 = vunpcklps_avx(auVar33,auVar35);
              auVar32 = vunpckhps_avx(auVar33,auVar35);
              auVar35 = vunpcklps_avx(*(undefined1 (*) [16])
                                       (pfVar10 + *(uint *)(uVar24 + 0x20 + lVar21)),
                                      *(undefined1 (*) [16])
                                       (pfVar12 + *(uint *)(uVar24 + 0x28 + lVar21)));
              auVar52 = vunpckhps_avx(*(undefined1 (*) [16])
                                       (pfVar10 + *(uint *)(uVar24 + 0x20 + lVar21)),
                                      *(undefined1 (*) [16])
                                       (pfVar12 + *(uint *)(uVar24 + 0x28 + lVar21)));
              auVar38 = vunpcklps_avx(*(undefined1 (*) [16])
                                       (pfVar11 + *(uint *)(uVar24 + 0x24 + lVar21)),
                                      *(undefined1 (*) [16])
                                       (pfVar13 + *(uint *)(uVar24 + 0x2c + lVar21)));
              auVar33 = vunpckhps_avx(*(undefined1 (*) [16])
                                       (pfVar11 + *(uint *)(uVar24 + 0x24 + lVar21)),
                                      *(undefined1 (*) [16])
                                       (pfVar13 + *(uint *)(uVar24 + 0x2c + lVar21)));
              auVar41 = vunpcklps_avx(auVar52,auVar33);
              auVar40 = vunpcklps_avx(auVar35,auVar38);
              puVar4 = (undefined8 *)(uVar24 + 0x30 + lVar21);
              local_1328 = *puVar4;
              uStack_1320 = puVar4[1];
              puVar4 = (undefined8 *)(uVar24 + 0x40 + lVar21);
              local_1338 = *puVar4;
              uStack_1330 = puVar4[1];
              auVar33 = vunpckhps_avx(auVar35,auVar38);
              mapUV = (UVIdentity<4>)0x0;
              uVar5 = *(undefined4 *)&(ray->org).field_0;
              auVar42._4_4_ = uVar5;
              auVar42._0_4_ = uVar5;
              auVar42._8_4_ = uVar5;
              auVar42._12_4_ = uVar5;
              uVar5 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
              auVar43._4_4_ = uVar5;
              auVar43._0_4_ = uVar5;
              auVar43._8_4_ = uVar5;
              auVar43._12_4_ = uVar5;
              auVar35 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->org).field_0.m128[2]));
              uVar5 = *(undefined4 *)&(ray->dir).field_0;
              auVar65._4_4_ = uVar5;
              auVar65._0_4_ = uVar5;
              auVar65._8_4_ = uVar5;
              auVar65._12_4_ = uVar5;
              uVar5 = *(undefined4 *)((long)&(ray->dir).field_0 + 4);
              auVar66._4_4_ = uVar5;
              auVar66._0_4_ = uVar5;
              auVar66._8_4_ = uVar5;
              auVar66._12_4_ = uVar5;
              local_12e8 = &mapUV;
              fVar6 = (ray->dir).field_0.m128[2];
              auVar67._4_4_ = fVar6;
              auVar67._0_4_ = fVar6;
              auVar67._8_4_ = fVar6;
              auVar67._12_4_ = fVar6;
              auVar52 = vsubps_avx(auVar36,auVar42);
              auVar31 = vsubps_avx(auVar31,auVar43);
              auVar36 = vsubps_avx512vl(auVar34,auVar35);
              auVar37 = vsubps_avx512vl(auVar37,auVar42);
              auVar38 = vsubps_avx512vl(auVar32,auVar43);
              auVar39 = vsubps_avx512vl(auVar39,auVar35);
              auVar32 = vsubps_avx(auVar40,auVar42);
              auVar40 = vsubps_avx512vl(auVar33,auVar43);
              auVar35 = vsubps_avx512vl(auVar41,auVar35);
              auVar33 = vsubps_avx(auVar32,auVar52);
              auVar41 = vsubps_avx512vl(auVar40,auVar31);
              auVar42 = vsubps_avx512vl(auVar35,auVar36);
              auVar43 = vsubps_avx512vl(auVar52,auVar37);
              auVar44 = vsubps_avx512vl(auVar31,auVar38);
              auVar45 = vsubps_avx512vl(auVar36,auVar39);
              auVar46 = vsubps_avx512vl(auVar37,auVar32);
              auVar47 = vsubps_avx512vl(auVar38,auVar40);
              auVar48 = vsubps_avx512vl(auVar39,auVar35);
              auVar51._0_4_ = auVar32._0_4_ + auVar52._0_4_;
              auVar51._4_4_ = auVar32._4_4_ + auVar52._4_4_;
              auVar51._8_4_ = auVar32._8_4_ + auVar52._8_4_;
              auVar51._12_4_ = auVar32._12_4_ + auVar52._12_4_;
              auVar34 = vaddps_avx512vl(auVar40,auVar31);
              auVar49 = vaddps_avx512vl(auVar35,auVar36);
              auVar50 = vmulps_avx512vl(auVar34,auVar42);
              auVar50 = vfmsub231ps_avx512vl(auVar50,auVar41,auVar49);
              auVar49 = vmulps_avx512vl(auVar49,auVar33);
              auVar49 = vfmsub231ps_avx512vl(auVar49,auVar42,auVar51);
              auVar63._0_4_ = auVar41._0_4_ * auVar51._0_4_;
              auVar63._4_4_ = auVar41._4_4_ * auVar51._4_4_;
              auVar63._8_4_ = auVar41._8_4_ * auVar51._8_4_;
              auVar63._12_4_ = auVar41._12_4_ * auVar51._12_4_;
              auVar34 = vfmsub231ps_fma(auVar63,auVar33,auVar34);
              auVar64._0_4_ = fVar6 * auVar34._0_4_;
              auVar64._4_4_ = fVar6 * auVar34._4_4_;
              auVar64._8_4_ = fVar6 * auVar34._8_4_;
              auVar64._12_4_ = fVar6 * auVar34._12_4_;
              auVar34 = vfmadd231ps_avx512vl(auVar64,auVar66,auVar49);
              local_1318 = vfmadd231ps_avx512vl(auVar34,auVar65,auVar50);
              auVar34 = vaddps_avx512vl(auVar52,auVar37);
              auVar49 = vaddps_avx512vl(auVar31,auVar38);
              auVar50 = vaddps_avx512vl(auVar36,auVar39);
              auVar51 = vmulps_avx512vl(auVar49,auVar45);
              auVar51 = vfmsub231ps_avx512vl(auVar51,auVar44,auVar50);
              auVar50 = vmulps_avx512vl(auVar50,auVar43);
              auVar50 = vfmsub231ps_avx512vl(auVar50,auVar45,auVar34);
              auVar34 = vmulps_avx512vl(auVar34,auVar44);
              auVar34 = vfmsub231ps_avx512vl(auVar34,auVar43,auVar49);
              auVar49._0_4_ = fVar6 * auVar34._0_4_;
              auVar49._4_4_ = fVar6 * auVar34._4_4_;
              auVar49._8_4_ = fVar6 * auVar34._8_4_;
              auVar49._12_4_ = fVar6 * auVar34._12_4_;
              auVar34 = vfmadd231ps_avx512vl(auVar49,auVar66,auVar50);
              local_1308 = vfmadd231ps_avx512vl(auVar34,auVar65,auVar51);
              auVar32 = vaddps_avx512vl(auVar37,auVar32);
              auVar34 = vaddps_avx512vl(auVar38,auVar40);
              auVar35 = vaddps_avx512vl(auVar39,auVar35);
              auVar39 = vmulps_avx512vl(auVar34,auVar48);
              auVar39 = vfmsub231ps_avx512vl(auVar39,auVar47,auVar35);
              auVar35 = vmulps_avx512vl(auVar35,auVar46);
              auVar35 = vfmsub231ps_avx512vl(auVar35,auVar48,auVar32);
              auVar38._0_4_ = auVar32._0_4_ * auVar47._0_4_;
              auVar38._4_4_ = auVar32._4_4_ * auVar47._4_4_;
              auVar38._8_4_ = auVar32._8_4_ * auVar47._8_4_;
              auVar38._12_4_ = auVar32._12_4_ * auVar47._12_4_;
              auVar32 = vfmsub231ps_avx512vl(auVar38,auVar46,auVar34);
              auVar32 = vmulps_avx512vl(auVar67,auVar32);
              auVar32 = vfmadd231ps_avx512vl(auVar32,auVar66,auVar35);
              auVar32 = vfmadd231ps_avx512vl(auVar32,auVar65,auVar39);
              auVar40._0_4_ = local_1308._0_4_ + local_1318._0_4_;
              auVar40._4_4_ = local_1308._4_4_ + local_1318._4_4_;
              auVar40._8_4_ = local_1308._8_4_ + local_1318._8_4_;
              auVar40._12_4_ = local_1308._12_4_ + local_1318._12_4_;
              local_12f8 = vaddps_avx512vl(auVar32,auVar40);
              auVar35._8_4_ = 0x7fffffff;
              auVar35._0_8_ = 0x7fffffff7fffffff;
              auVar35._12_4_ = 0x7fffffff;
              auVar34 = vandps_avx512vl(local_12f8,auVar35);
              auVar39._8_4_ = 0x34000000;
              auVar39._0_8_ = 0x3400000034000000;
              auVar39._12_4_ = 0x34000000;
              auVar35 = vmulps_avx512vl(auVar34,auVar39);
              auVar39 = vminps_avx512vl(local_1318,local_1308);
              auVar39 = vminps_avx512vl(auVar39,auVar32);
              auVar37._8_4_ = 0x80000000;
              auVar37._0_8_ = 0x8000000080000000;
              auVar37._12_4_ = 0x80000000;
              auVar37 = vxorps_avx512vl(auVar35,auVar37);
              uVar19 = vcmpps_avx512vl(auVar39,auVar37,5);
              auVar39 = vmaxps_avx512vl(local_1318,local_1308);
              auVar32 = vmaxps_avx512vl(auVar39,auVar32);
              uVar17 = vcmpps_avx512vl(auVar32,auVar35,2);
              local_12e0 = ((byte)uVar19 | (byte)uVar17) & 0xf;
              if (local_12e0 != 0) {
                auVar32 = vmulps_avx512vl(auVar42,auVar44);
                auVar35 = vmulps_avx512vl(auVar33,auVar45);
                auVar39 = vmulps_avx512vl(auVar41,auVar43);
                auVar37 = vmulps_avx512vl(auVar45,auVar47);
                auVar38 = vmulps_avx512vl(auVar43,auVar48);
                auVar40 = vmulps_avx512vl(auVar44,auVar46);
                auVar41 = vfmsub213ps_avx512vl(auVar41,auVar45,auVar32);
                auVar42 = vfmsub213ps_avx512vl(auVar42,auVar43,auVar35);
                auVar33 = vfmsub213ps_avx512vl(auVar33,auVar44,auVar39);
                auVar44 = vfmsub213ps_avx512vl(auVar48,auVar44,auVar37);
                auVar45 = vfmsub213ps_avx512vl(auVar46,auVar45,auVar38);
                auVar43 = vfmsub213ps_avx512vl(auVar47,auVar43,auVar40);
                auVar46 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                auVar32 = vandps_avx512vl(auVar32,auVar46);
                auVar37 = vandps_avx512vl(auVar37,auVar46);
                uVar22 = vcmpps_avx512vl(auVar32,auVar37,1);
                auVar32 = vandps_avx512vl(auVar35,auVar46);
                auVar35 = vandps_avx512vl(auVar38,auVar46);
                uVar26 = vcmpps_avx512vl(auVar32,auVar35,1);
                auVar32 = vandps_avx512vl(auVar39,auVar46);
                auVar35 = vandps_avx512vl(auVar40,auVar46);
                uVar27 = vcmpps_avx512vl(auVar32,auVar35,1);
                bVar16 = (bool)((byte)uVar22 & 1);
                local_12a8._0_4_ = (uint)bVar16 * auVar41._0_4_ | (uint)!bVar16 * auVar44._0_4_;
                bVar16 = (bool)((byte)(uVar22 >> 1) & 1);
                local_12a8._4_4_ = (uint)bVar16 * auVar41._4_4_ | (uint)!bVar16 * auVar44._4_4_;
                bVar16 = (bool)((byte)(uVar22 >> 2) & 1);
                local_12a8._8_4_ = (uint)bVar16 * auVar41._8_4_ | (uint)!bVar16 * auVar44._8_4_;
                bVar16 = (bool)((byte)(uVar22 >> 3) & 1);
                local_12a8._12_4_ = (uint)bVar16 * auVar41._12_4_ | (uint)!bVar16 * auVar44._12_4_;
                bVar16 = (bool)((byte)uVar26 & 1);
                local_1298._0_4_ = (uint)bVar16 * auVar42._0_4_ | (uint)!bVar16 * auVar45._0_4_;
                bVar16 = (bool)((byte)(uVar26 >> 1) & 1);
                local_1298._4_4_ = (uint)bVar16 * auVar42._4_4_ | (uint)!bVar16 * auVar45._4_4_;
                bVar16 = (bool)((byte)(uVar26 >> 2) & 1);
                local_1298._8_4_ = (uint)bVar16 * auVar42._8_4_ | (uint)!bVar16 * auVar45._8_4_;
                bVar16 = (bool)((byte)(uVar26 >> 3) & 1);
                local_1298._12_4_ = (uint)bVar16 * auVar42._12_4_ | (uint)!bVar16 * auVar45._12_4_;
                bVar16 = (bool)((byte)uVar27 & 1);
                local_1288._0_4_ =
                     (float)((uint)bVar16 * auVar33._0_4_ | (uint)!bVar16 * auVar43._0_4_);
                bVar16 = (bool)((byte)(uVar27 >> 1) & 1);
                local_1288._4_4_ =
                     (float)((uint)bVar16 * auVar33._4_4_ | (uint)!bVar16 * auVar43._4_4_);
                bVar16 = (bool)((byte)(uVar27 >> 2) & 1);
                local_1288._8_4_ =
                     (float)((uint)bVar16 * auVar33._8_4_ | (uint)!bVar16 * auVar43._8_4_);
                bVar16 = (bool)((byte)(uVar27 >> 3) & 1);
                local_1288._12_4_ =
                     (float)((uint)bVar16 * auVar33._12_4_ | (uint)!bVar16 * auVar43._12_4_);
                auVar47._0_4_ = fVar6 * local_1288._0_4_;
                auVar47._4_4_ = fVar6 * local_1288._4_4_;
                auVar47._8_4_ = fVar6 * local_1288._8_4_;
                auVar47._12_4_ = fVar6 * local_1288._12_4_;
                auVar32 = vfmadd213ps_fma(auVar66,local_1298,auVar47);
                auVar32 = vfmadd213ps_fma(auVar65,local_12a8,auVar32);
                auVar45._0_4_ = auVar32._0_4_ + auVar32._0_4_;
                auVar45._4_4_ = auVar32._4_4_ + auVar32._4_4_;
                auVar45._8_4_ = auVar32._8_4_ + auVar32._8_4_;
                auVar45._12_4_ = auVar32._12_4_ + auVar32._12_4_;
                auVar46._0_4_ = auVar36._0_4_ * local_1288._0_4_;
                auVar46._4_4_ = auVar36._4_4_ * local_1288._4_4_;
                auVar46._8_4_ = auVar36._8_4_ * local_1288._8_4_;
                auVar46._12_4_ = auVar36._12_4_ * local_1288._12_4_;
                auVar31 = vfmadd213ps_fma(auVar31,local_1298,auVar46);
                auVar31 = vfmadd213ps_fma(auVar52,local_12a8,auVar31);
                auVar52 = vrcp14ps_avx512vl(auVar45);
                auVar33 = auVar68._0_16_;
                auVar32 = vfnmadd213ps_avx512vl(auVar52,auVar45,auVar33);
                auVar52 = vfmadd132ps_fma(auVar32,auVar52,auVar52);
                local_12b8._0_4_ = (auVar31._0_4_ + auVar31._0_4_) * auVar52._0_4_;
                local_12b8._4_4_ = (auVar31._4_4_ + auVar31._4_4_) * auVar52._4_4_;
                local_12b8._8_4_ = (auVar31._8_4_ + auVar31._8_4_) * auVar52._8_4_;
                local_12b8._12_4_ = (auVar31._12_4_ + auVar31._12_4_) * auVar52._12_4_;
                uVar5 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
                auVar52._4_4_ = uVar5;
                auVar52._0_4_ = uVar5;
                auVar52._8_4_ = uVar5;
                auVar52._12_4_ = uVar5;
                uVar19 = vcmpps_avx512vl(local_12b8,auVar52,0xd);
                auVar41._8_4_ = 0x80000000;
                auVar41._0_8_ = 0x8000000080000000;
                auVar41._12_4_ = 0x80000000;
                auVar52 = vxorps_avx512vl(auVar45,auVar41);
                fVar6 = ray->tfar;
                auVar44._4_4_ = fVar6;
                auVar44._0_4_ = fVar6;
                auVar44._8_4_ = fVar6;
                auVar44._12_4_ = fVar6;
                uVar17 = vcmpps_avx512vl(local_12b8,auVar44,2);
                uVar18 = vcmpps_avx512vl(auVar45,auVar52,4);
                local_12e0 = (byte)uVar19 & (byte)uVar17 & (byte)uVar18 & local_12e0;
                if (local_12e0 != 0) {
                  auVar48._8_4_ = 0x219392ef;
                  auVar48._0_8_ = 0x219392ef219392ef;
                  auVar48._12_4_ = 0x219392ef;
                  uVar22 = vcmpps_avx512vl(auVar34,auVar48,5);
                  auVar52 = vrcp14ps_avx512vl(local_12f8);
                  auVar31 = vfnmadd213ps_avx512vl(local_12f8,auVar52,auVar33);
                  auVar52 = vfmadd132ps_avx512vl(auVar31,auVar52,auVar52);
                  fVar6 = (float)((uint)((byte)uVar22 & 1) * auVar52._0_4_);
                  fVar1 = (float)((uint)((byte)(uVar22 >> 1) & 1) * auVar52._4_4_);
                  fVar2 = (float)((uint)((byte)(uVar22 >> 2) & 1) * auVar52._8_4_);
                  fVar3 = (float)((uint)((byte)(uVar22 >> 3) & 1) * auVar52._12_4_);
                  auVar50._0_4_ = fVar6 * local_1318._0_4_;
                  auVar50._4_4_ = fVar1 * local_1318._4_4_;
                  auVar50._8_4_ = fVar2 * local_1318._8_4_;
                  auVar50._12_4_ = fVar3 * local_1318._12_4_;
                  local_12d8 = vminps_avx512vl(auVar50,auVar33);
                  auVar62._0_4_ = fVar6 * local_1308._0_4_;
                  auVar62._4_4_ = fVar1 * local_1308._4_4_;
                  auVar62._8_4_ = fVar2 * local_1308._8_4_;
                  auVar62._12_4_ = fVar3 * local_1308._12_4_;
                  local_12c8 = vminps_avx512vl(auVar62,auVar33);
                  uVar22 = (ulong)local_12e0;
                  do {
                    uVar26 = 0;
                    for (uVar27 = uVar22; (uVar27 & 1) == 0;
                        uVar27 = uVar27 >> 1 | 0x8000000000000000) {
                      uVar26 = uVar26 + 1;
                    }
                    h.geomID = *(uint *)((long)&local_1328 + uVar26 * 4);
                    pGVar14 = (pSVar8->geometries).items[h.geomID].ptr;
                    if ((pGVar14->mask & ray->mask) == 0) {
LAB_0072339f:
                      uVar22 = uVar22 ^ 1L << (uVar26 & 0x3f);
                      bVar16 = true;
                    }
                    else {
                      pRVar15 = context->args;
                      if ((pRVar15->filter != (RTCFilterFunctionN)0x0) ||
                         (pGVar14->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                        uVar27 = (ulong)(uint)((int)uVar26 * 4);
                        h.u = *(float *)(local_12d8 + uVar27);
                        h.v = *(float *)(local_12c8 + uVar27);
                        args.context = context->user;
                        h.primID = *(uint *)((long)&local_1338 + uVar27);
                        h.Ng.field_0.field_0.x = (float)*(undefined4 *)(local_12a8 + uVar27);
                        h.Ng.field_0.field_0.y = (float)*(undefined4 *)(local_1298 + uVar27);
                        h.Ng.field_0.field_0.z = (float)*(undefined4 *)(local_1288 + uVar27);
                        h.instID[0] = (args.context)->instID[0];
                        h.instPrimID[0] = (args.context)->instPrimID[0];
                        fVar6 = ray->tfar;
                        ray->tfar = *(float *)(local_12b8 + uVar27);
                        local_14b4 = -1;
                        args.valid = &local_14b4;
                        args.geometryUserPtr = pGVar14->userPtr;
                        args.hit = (RTCHitN *)&h;
                        args.N = 1;
                        local_11f8 = auVar69._0_32_;
                        local_1218 = auVar70._0_32_;
                        local_1238 = auVar71._0_32_;
                        local_1258 = auVar72._0_32_;
                        local_1278 = auVar73._0_32_;
                        args.ray = (RTCRayN *)ray;
                        if (pGVar14->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                          local_1478 = ray;
                          local_1470 = context;
                          (*pGVar14->occlusionFilterN)(&args);
                          auVar73 = ZEXT3264(local_1278);
                          auVar72 = ZEXT3264(local_1258);
                          auVar71 = ZEXT3264(local_1238);
                          auVar70 = ZEXT3264(local_1218);
                          auVar69 = ZEXT3264(local_11f8);
                          auVar52 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                          auVar68 = ZEXT1664(auVar52);
                          ray = local_1478;
                          context = local_1470;
                          if (*args.valid != 0) goto LAB_007235a7;
LAB_00723681:
                          ray->tfar = fVar6;
                          goto LAB_0072339f;
                        }
LAB_007235a7:
                        if (pRVar15->filter != (RTCFilterFunctionN)0x0) {
                          if (((pRVar15->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                             (((pGVar14->field_8).field_0x2 & 0x40) != 0)) {
                            (*pRVar15->filter)(&args);
                            auVar73 = ZEXT3264(local_1278);
                            auVar72 = ZEXT3264(local_1258);
                            auVar71 = ZEXT3264(local_1238);
                            auVar70 = ZEXT3264(local_1218);
                            auVar69 = ZEXT3264(local_11f8);
                            auVar52 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                            auVar68 = ZEXT1664(auVar52);
                          }
                          if (*args.valid == 0) goto LAB_00723681;
                        }
                      }
                      bVar16 = false;
                    }
                    iVar25 = 0;
                    if (!bVar16) {
                      uVar22 = local_1480;
                      uVar26 = local_1488;
                      uVar27 = local_1490;
                      uVar28 = local_1498;
                      uVar29 = local_14a0;
                      if (bVar30) {
                        ray->tfar = -INFINITY;
                        iVar25 = 3;
                      }
                      goto LAB_00723705;
                    }
                  } while (uVar22 != 0);
                }
              }
              iVar25 = 0;
              local_1460 = local_1460 + 1;
              bVar30 = local_1460 < local_1468;
              uVar22 = local_1480;
              uVar26 = local_1488;
              uVar27 = local_1490;
              uVar28 = local_1498;
              uVar29 = local_14a0;
            } while (local_1460 != local_1468);
          }
        }
LAB_00723705:
      } while (iVar25 != 3);
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }